

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall gl3cts::TransformFeedback::DrawXFBFeedback::prepareAndBind(DrawXFBFeedback *this)

{
  GLuint *pGVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  GLuint i;
  long lVar6;
  Functions *gl;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  GVar3 = Utilities::buildProgram
                    (gl,this->m_context->m_testCtx->m_log,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
                     s_vertex_shader,s_fragment_shader,&s_xfb_varying,1,0x8c8c,false,(GLint *)0x0);
  this->m_program_id = GVar3;
  if (GVar3 != 0) {
    (*gl->useProgram)(GVar3);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glUseProgram call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1308);
    (*gl->genTransformFeedbacks)(1,&this->m_xfb_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x130c);
    (*gl->bindTransformFeedback)(0x8e22,this->m_xfb_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x130f);
    (*gl->genBuffers)(2,this->m_bo_id);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenBuffers call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1313);
    (*gl->bindBuffer)(0x8892,this->m_bo_id[0]);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1316);
    (*gl->bufferData)(0x8892,0x10,s_initial_data,0x88ea);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1319);
    lVar6 = 0;
    (*gl->bindBufferBase)(0x8c8e,0,this->m_bo_id[1]);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x131c);
    (*gl->bufferData)(0x8c8e,0x10,(void *)0x0,0x88ea);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x131f);
    pGVar1 = this->m_vao_id;
    (*gl->genVertexArrays)(2,pGVar1);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGenVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1323);
    GVar3 = (*gl->getAttribLocation)(this->m_program_id,"position");
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glGetAttribLocation call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1326);
    do {
      (*gl->bindVertexArray)(pGVar1[lVar6]);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glBindVertexArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x132b);
      (*gl->bindBuffer)(0x8892,this->m_bo_id[lVar6]);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glBindBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x132e);
      (*gl->vertexAttribPointer)(GVar3,4,0x1406,'\0',0,(void *)0x0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glVertexAttribPointer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1331);
      (*gl->enableVertexAttribArray)(GVar3);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glEnableVertexAttribArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x1334);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    (*gl->bindBuffer)(0x8892,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1338);
    (*gl->bindVertexArray)(*pGVar1);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"glBindVertexArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x133b);
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::DrawXFBFeedback::prepareAndBind()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare programs. */
	m_program_id = gl3cts::TransformFeedback::Utilities::buildProgram(gl, m_context.getTestContext().getLog(), NULL,
																	  NULL, NULL, s_vertex_shader, s_fragment_shader,
																	  &s_xfb_varying, 1, GL_INTERLEAVED_ATTRIBS);

	if (0 == m_program_id)
	{
		throw 0;
	}

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	/* Prepare transform feedbacks. */
	gl.genTransformFeedbacks(1, &m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfb_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedbacks call failed.");

	/* Prepare buffer objects. */
	gl.genBuffers(s_bo_count, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, s_bo_size, s_initial_data, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id[1]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, s_bo_size, NULL, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	/* Setup vertex arrays. */
	gl.genVertexArrays(s_bo_count, m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	glw::GLuint position_location = gl.getAttribLocation(m_program_id, "position");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetAttribLocation call failed.");

	for (glw::GLuint i = 0; i < 2; ++i)
	{
		gl.bindVertexArray(m_vao_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

		gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.vertexAttribPointer(position_location, 4, GL_FLOAT, GL_FALSE, 0, NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer call failed.");

		gl.enableVertexAttribArray(position_location);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");
	}

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bindVertexArray(m_vao_id[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");
}